

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

uint __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::find_index(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
             *this,cluster_id *k)

{
  raw_node *prVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  cluster_id *this_00;
  
  if (this->m_num_valid != 0) {
    uVar5 = (uint)((int)k->m_hash * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
    uVar4 = (ulong)uVar5;
    prVar1 = (this->m_values).m_p;
    if (prVar1[uVar4].m_bits[0x1c] != '\0') {
      this_00 = (cluster_id *)(prVar1 + uVar4);
      bVar2 = qdxt1::cluster_id::operator==(this_00,k);
      uVar3 = uVar5;
      while( true ) {
        if (bVar2) {
          return uVar3;
        }
        if ((int)uVar4 == 0) {
          uVar4 = (ulong)((this->m_values).m_size - 1);
          this_00 = (cluster_id *)((this->m_values).m_p + uVar4);
        }
        else {
          uVar4 = (ulong)((int)uVar4 - 1);
          this_00 = (cluster_id *)&this_00[-2].m_hash;
        }
        uVar3 = (uint)uVar4;
        if ((uVar3 == uVar5) || (*(char *)((long)&this_00[1].m_cells.m_p + 4) == '\0')) break;
        bVar2 = qdxt1::cluster_id::operator==(this_00,k);
      }
    }
  }
  return (this->m_values).m_size;
}

Assistant:

inline uint find_index(const Key& k) const {
    if (m_num_valid) {
      int index = hash_key(k);
      const node* pNode = &get_node(index);

      if (pNode->state) {
        if (m_equals(pNode->first, k))
          return index;

        const int orig_index = index;

        for (;;) {
          if (!index) {
            index = m_values.size() - 1;
            pNode = &get_node(index);
          } else {
            index--;
            pNode--;
          }

          if (index == orig_index)
            break;

          if (!pNode->state)
            break;

          if (m_equals(pNode->first, k))
            return index;
        }
      }
    }

    return m_values.size();
  }